

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void jpgd::jpeg_decoder::decode_block_dc_first
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  uint uVar1;
  uint uVar2;
  jpeg_decoder *this;
  undefined4 in_ECX;
  undefined4 in_EDX;
  int iVar3;
  int in_ESI;
  long in_RDI;
  jpgd_block_t *p;
  int r;
  int s;
  jpgd_status in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  coeff_buf *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  
  this = (jpeg_decoder *)
         coeff_buf_getp((jpeg_decoder *)
                        CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                        in_stack_ffffffffffffffd0);
  uVar1 = huff_decode((jpeg_decoder *)CONCAT44(in_ESI,in_EDX),
                      (huff_tables *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8));
  uVar2 = uVar1;
  if (uVar1 != 0) {
    if (0xf < (int)uVar1) {
      stop_decoding((jpeg_decoder *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffcc);
    }
    uVar2 = get_bits_no_markers(this,in_stack_ffffffffffffffd4);
    if ((int)uVar2 < *(int *)(s_extend_test + (long)(int)(uVar1 & 0xf) * 4)) {
      uVar2 = uVar2 + *(int *)(s_extend_offset + (long)(int)(uVar1 & 0xf) * 4);
    }
  }
  iVar3 = *(int *)(in_RDI + 0x2468 + (long)in_ESI * 4) + uVar2;
  *(int *)(in_RDI + 0x2468 + (long)in_ESI * 4) = iVar3;
  *(short *)this->m_jmp_state[0].__jmpbuf =
       (short)(iVar3 << ((byte)*(undefined4 *)(in_RDI + 0x23c) & 0x1f));
  return;
}

Assistant:

void jpeg_decoder::decode_block_dc_first(jpeg_decoder* pD, int component_id, int block_x, int block_y)
	{
		int s, r;
		jpgd_block_t* p = pD->coeff_buf_getp(pD->m_dc_coeffs[component_id], block_x, block_y);

		if ((s = pD->huff_decode(pD->m_pHuff_tabs[pD->m_comp_dc_tab[component_id]])) != 0)
		{
			if (s >= 16)
				pD->stop_decoding(JPGD_DECODE_ERROR);

			r = pD->get_bits_no_markers(s);
			s = JPGD_HUFF_EXTEND(r, s);
		}

		pD->m_last_dc_val[component_id] = (s += pD->m_last_dc_val[component_id]);

		p[0] = static_cast<jpgd_block_t>(s << pD->m_successive_low);
	}